

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord.hh
# Opt level: O0

void avro::codec_traits<testgen::RootRecord>::encode(Encoder *e,RootRecord *v)

{
  Encoder *in_RSI;
  _bigrecord_Union__0__ *in_stack_00000018;
  Encoder *in_stack_00000020;
  Nested *in_stack_ffffffffffffffe8;
  
  encode<long>(in_RSI,(long *)in_stack_ffffffffffffffe8);
  encode<testgen::Nested>(in_RSI,in_stack_ffffffffffffffe8);
  encode<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
            (in_RSI,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)in_stack_ffffffffffffffe8);
  encode<std::map<std::__cxx11::string,testgen::Nested,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testgen::Nested>>>>
            (in_RSI,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen::Nested>_>_>
                     *)in_stack_ffffffffffffffe8);
  encode<std::vector<double,std::allocator<double>>>
            (in_RSI,(vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffe8);
  encode<testgen::ExampleEnum>(in_RSI,(ExampleEnum *)in_stack_ffffffffffffffe8);
  encode<testgen::_bigrecord_Union__0__>(in_stack_00000020,in_stack_00000018);
  encode<testgen::_bigrecord_Union__1__>
            (in_stack_00000020,(_bigrecord_Union__1__ *)in_stack_00000018);
  encode<bool>(in_RSI,(bool *)in_stack_ffffffffffffffe8);
  encode<testgen::Nested>(in_RSI,in_stack_ffffffffffffffe8);
  encode<boost::array<unsigned_char,16ul>>
            (in_RSI,(array<unsigned_char,_16UL> *)in_stack_ffffffffffffffe8);
  encode<int>(in_RSI,(int *)in_stack_ffffffffffffffe8);
  encode<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_RSI,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void encode(Encoder& e, const testgen::RootRecord& v) {
        avro::encode(e, v.mylong);
        avro::encode(e, v.nestedrecord);
        avro::encode(e, v.mymap);
        avro::encode(e, v.recordmap);
        avro::encode(e, v.myarray);
        avro::encode(e, v.myenum);
        avro::encode(e, v.myunion);
        avro::encode(e, v.anotherunion);
        avro::encode(e, v.mybool);
        avro::encode(e, v.anothernested);
        avro::encode(e, v.myfixed);
        avro::encode(e, v.anotherint);
        avro::encode(e, v.bytes);
    }